

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Maybe<kj::Own<kj::AppendableFile>_> __thiscall
kj::anon_unknown_35::InMemoryDirectory::tryAppendFile
          (InMemoryDirectory *this,PathPtr path,WriteMode mode)

{
  _func_int **pp_Var1;
  Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> MVar2;
  undefined4 in_register_0000000c;
  long lVar3;
  AppendableFile *pAVar4;
  AppendableFile *extraout_RDX;
  AppendableFile *extraout_RDX_01;
  _func_int **pp_Var6;
  AppendableFile *extraout_RDX_02;
  AppendableFile *extraout_RDX_03;
  WriteMode in_R8D;
  Maybe<kj::Own<kj::AppendableFile>_> MVar7;
  Maybe<kj::Own<const_kj::Directory>_> MVar8;
  StringPtr name;
  StringPtr name_00;
  Fault f;
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  AppendableFile *extraout_RDX_00;
  AppendableFile *pAVar5;
  
  lVar3 = CONCAT44(in_register_0000000c,mode);
  pAVar4 = (AppendableFile *)path.parts.size_;
  name_00.content.ptr = (Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)path.parts.ptr
  ;
  if (lVar3 == 1) {
    _::Mutex::lock((Mutex *)&name_00.content.ptr[1].ptr,EXCLUSIVE);
    local_48._8_8_ = name_00.content.ptr + 3;
    pp_Var1 = (pAVar4->super_OutputStream)._vptr_OutputStream;
    if (pp_Var1 == (_func_int **)0x0) {
      pp_Var6 = (_func_int **)0x22a50f;
    }
    else {
      pp_Var6 = (pAVar4->super_FsNode)._vptr_FsNode;
    }
    name.content.size_ = (long)pp_Var1 + (ulong)(pp_Var1 == (_func_int **)0x0);
    name.content.ptr = (char *)pp_Var6;
    local_48._0_8_ = &name_00.content.ptr[1].ptr;
    MVar2 = Impl::openEntry((Impl *)local_48._8_8_,name,in_R8D);
    if (MVar2.ptr == (EntryImpl *)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
      pAVar5 = extraout_RDX_00;
    }
    else {
      asFile((InMemoryDirectory *)local_58,name_00.content.ptr,(EntryImpl *)local_48,
             (WriteMode)MVar2.ptr);
      MVar7 = Maybe<kj::Own<const_kj::File>_>::
              map<kj::Own<kj::AppendableFile>_(&)(kj::Own<const_kj::File>)>
                        ((Maybe<kj::Own<const_kj::File>_> *)this,
                         (_func_Own<kj::AppendableFile>_Own<const_kj::File> *)local_58);
      pAVar5 = MVar7.ptr.ptr;
      if ((_func_int **)local_58._8_8_ != (_func_int **)0x0) {
        local_58._8_8_ = (_func_int **)0x0;
        (**(code **)*(_func_int **)local_58._0_8_)();
        pAVar5 = extraout_RDX_01;
      }
    }
    if ((Exception *)local_48._0_8_ != (Exception *)0x0) {
      _::Mutex::unlock((Mutex *)local_48._0_8_,EXCLUSIVE);
      pAVar5 = extraout_RDX_03;
    }
  }
  else if (lVar3 == 0) {
    if ((in_R8D & MODIFY) == 0) {
      if ((in_R8D & CREATE) != 0) {
        (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             (_func_int **)0x0;
        (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
        pAVar5 = pAVar4;
        goto LAB_0021716e;
      }
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                ((Fault *)local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x4bd,FAILED,(char *)0x0,"\"can\'t replace self\"",
                 (char (*) [19])"can\'t replace self");
    }
    else {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[11]>
                ((Fault *)local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x4b9,FAILED,(char *)0x0,"\"not a file\"",(char (*) [11])"not a file");
    }
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    _::Debug::Fault::~Fault((Fault *)local_48);
    pAVar5 = extraout_RDX;
  }
  else {
    pp_Var1 = (pAVar4->super_OutputStream)._vptr_OutputStream;
    if (pp_Var1 == (_func_int **)0x0) {
      pp_Var6 = (_func_int **)0x22a50f;
    }
    else {
      pp_Var6 = (pAVar4->super_FsNode)._vptr_FsNode;
    }
    name_00.content.size_ = (size_t)pp_Var6;
    MVar8 = tryGetParent((InMemoryDirectory *)local_48,name_00,
                         (int)pp_Var1 + (uint)(pp_Var1 == (_func_int **)0x0));
    pAVar5 = (AppendableFile *)MVar8.ptr.ptr;
    local_48._16_8_ = local_48._0_8_;
    if ((_func_int **)local_48._8_8_ == (_func_int **)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    }
    else {
      (**(code **)(*(_func_int **)local_48._8_8_ + 0x80))
                (this,local_48._8_8_,&pAVar4[1].super_OutputStream,lVar3 + -1,in_R8D);
      (**(code **)(((String *)local_48._16_8_)->content).ptr)
                (local_48._16_8_,local_48._8_8_ + *(long *)(*(_func_int **)local_48._8_8_ + -0x10));
      pAVar5 = extraout_RDX_02;
    }
  }
LAB_0021716e:
  MVar7.ptr.ptr = pAVar5;
  MVar7.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::AppendableFile>_>)MVar7.ptr;
}

Assistant:

Maybe<Own<AppendableFile>> tryAppendFile(PathPtr path, WriteMode mode) const override {
    if (path.size() == 0) {
      if (has(mode, WriteMode::MODIFY)) {
        KJ_FAIL_REQUIRE("not a file") { return nullptr; }
      } else if (has(mode, WriteMode::CREATE)) {
        return nullptr;  // already exists (as a directory)
      } else {
        KJ_FAIL_REQUIRE("can't replace self") { return nullptr; }
      }
    } else if (path.size() == 1) {
      auto lock = impl.lockExclusive();
      KJ_IF_MAYBE(entry, lock->openEntry(path[0], mode)) {
        return asFile(lock, *entry, mode).map(newFileAppender);
      } else {
        return nullptr;
      }
    } else {
      KJ_IF_MAYBE(child, tryGetParent(path[0], mode)) {
        return child->get()->tryAppendFile(path.slice(1, path.size()), mode);
      } else {
        return nullptr;
      }
    }
  }